

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  undefined1 (*pauVar5) [64];
  uint uVar6;
  undefined1 (*pauVar7) [64];
  undefined1 (*pauVar8) [64];
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar13 [64];
  
  uVar1 = a->c;
  uVar6 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar9 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        pauVar5 = (undefined1 (*) [64])(a->cstep * uVar4 * a->elemsize + (long)a->data);
        pauVar7 = (undefined1 (*) [64])(b->cstep * uVar4 * b->elemsize + (long)b->data);
        pauVar8 = (undefined1 (*) [64])(c->cstep * uVar4 * c->elemsize + (long)c->data);
        if ((int)uVar6 < 0x10) {
          uVar10 = 0;
        }
        else {
          iVar9 = 0xf;
          do {
            auVar13 = vminps_avx512f(*pauVar5,*pauVar7);
            *pauVar8 = auVar13;
            pauVar5 = pauVar5 + 1;
            pauVar7 = pauVar7 + 1;
            pauVar8 = pauVar8 + 1;
            iVar9 = iVar9 + 0x10;
            uVar10 = uVar6 & 0xfffffff0;
          } while (iVar9 < (int)uVar6);
        }
        uVar12 = uVar10 | 7;
        while ((int)uVar12 < (int)uVar6) {
          auVar3 = vminps_avx(*(undefined1 (*) [32])*pauVar5,*(undefined1 (*) [32])*pauVar7);
          *(undefined1 (*) [32])*pauVar8 = auVar3;
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
          pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x20);
          uVar12 = uVar10 + 0xf;
          uVar10 = uVar10 + 8;
        }
        uVar12 = uVar10 | 3;
        while ((int)uVar12 < (int)uVar6) {
          auVar2 = vminps_avx(*(undefined1 (*) [16])*pauVar5,*(undefined1 (*) [16])*pauVar7);
          *(undefined1 (*) [16])*pauVar8 = auVar2;
          pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
          pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
          pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x10);
          uVar12 = uVar10 + 7;
          uVar10 = uVar10 + 4;
        }
        if (uVar6 - uVar10 != 0 && (int)uVar10 <= (int)uVar6) {
          lVar11 = 0;
          do {
            auVar2 = vminss_avx(ZEXT416(*(uint *)(*pauVar7 + lVar11 * 4)),
                                ZEXT416(*(uint *)(*pauVar5 + lVar11 * 4)));
            *(int *)((long)*pauVar8 + lVar11 * 4) = auVar2._0_4_;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar10 != (int)lVar11);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}